

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O0

void __thiscall xe::ContainerFormatParser::~ContainerFormatParser(ContainerFormatParser *this)

{
  ContainerFormatParser *this_local;
  
  de::RingBuffer<unsigned_char>::~RingBuffer(&this->m_buf);
  std::__cxx11::string::~string((string *)&this->m_value);
  std::__cxx11::string::~string((string *)&this->m_attribute);
  return;
}

Assistant:

ContainerFormatParser::~ContainerFormatParser (void)
{
}